

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.cc
# Opt level: O2

bool __thiscall re2c::Enc::encode(Enc *this,uint32_t *c)

{
  uint uVar1;
  type_t tVar2;
  policy_t pVar3;
  uint32_t uVar4;
  
  uVar1 = *c;
  uVar4 = nCodePoints(this);
  if (uVar1 < uVar4) {
    tVar2 = this->type_;
    if (tVar2 - UCS2 < 4) {
      if (*c - 0xe000 < 0xfffff800) {
        return true;
      }
      pVar3 = this->policy_;
      if (pVar3 != POLICY_FAIL) {
        if (pVar3 == POLICY_IGNORE) {
          return true;
        }
        if (pVar3 == POLICY_SUBSTITUTE) {
          *c = 0xfffd;
          return true;
        }
      }
    }
    else {
      if (tVar2 == ASCII) {
        return true;
      }
      if (tVar2 == EBCDIC) {
        *c = *(uint32_t *)(asc2ebc + (ulong)*c * 4);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Enc::encode(uint32_t & c) const
{
	if (c >= nCodePoints ())
	{
		return false;
	}

	switch (type_)
	{
		case ASCII:
			return true;
		case EBCDIC:
			c = asc2ebc[c];
			return true;
		case UCS2:
		case UTF16:
		case UTF32:
		case UTF8:
			if (c < SURR_MIN || c > SURR_MAX)
				return true;
			else
			{
				switch (policy_)
				{
					case POLICY_FAIL:
						return false;
					case POLICY_SUBSTITUTE:
						c = UNICODE_ERROR;
						return true;
					case POLICY_IGNORE:
						return true;
				}
			}
	}
	return false; // to silence gcc warning
}